

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall duckdb::DatabaseInstance::LoadExtensionSettings(DatabaseInstance *this)

{
  key_type *__k;
  bool bVar1;
  iterator iVar2;
  type context;
  InvalidInputException *pIVar3;
  InternalException *this_00;
  ExtensionEntry (*in_RCX) [62];
  __node_base *p_Var4;
  __node_base _Var5;
  allocator local_169;
  string extension_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  options;
  Connection con;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  extension_options;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  case_insensitive_map_t<Value> unrecognized_options_copy;
  
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&unrecognized_options_copy._M_h,&(this->config).options.unrecognized_options._M_h);
  if ((this->config).options.autoload_known_extensions == true) {
    if (unrecognized_options_copy._M_h._M_element_count == 0) goto LAB_0146c0d6;
    Connection::Connection(&con,this);
    Connection::BeginTransaction(&con);
    extension_options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extension_options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extension_options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (_Var5 = unrecognized_options_copy._M_h._M_before_begin;
        _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
      __k = (key_type *)(_Var5._M_nxt + 1);
      ExtensionHelper::FindExtensionInEntries<62ul>
                (&extension_name,(ExtensionHelper *)__k,(string *)"azure_account_name",in_RCX);
      if (extension_name._M_string_length != 0) {
        bVar1 = ExtensionHelper::TryAutoLoadExtension(this,&extension_name);
        if (!bVar1) {
          pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&options,
                     "To set the %s setting, the %s extension needs to be loaded. But it could not be autoloaded."
                     ,&local_169);
          ::std::__cxx11::string::string((string *)&local_88,(string *)__k);
          ::std::__cxx11::string::string((string *)&local_a8,(string *)&extension_name);
          InvalidInputException::InvalidInputException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar3,(string *)&options,&local_88,&local_a8);
          __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        iVar2 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->config).extension_parameters._M_h,__k);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
            ._M_cur == (__node_type *)0x0) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&options,"Extension %s did not provide the \'%s\' config setting",
                     &local_169);
          ::std::__cxx11::string::string((string *)&local_c8,(string *)&extension_name);
          ::std::__cxx11::string::string((string *)&local_e8,(string *)__k);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (this_00,(string *)&options,&local_c8,&local_e8);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        context = shared_ptr<duckdb::ClientContext,_true>::operator*(&con.context);
        in_RCX = (ExtensionEntry (*) [62])0x3;
        PhysicalSet::SetExtensionVariable
                  (context,(ExtensionOption *)
                           ((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::ExtensionOption>,_true>
                                  ._M_cur + 0x28),__k,GLOBAL,(Value *)(_Var5._M_nxt + 5));
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&extension_options,__k);
      }
      ::std::__cxx11::string::~string((string *)&extension_name);
    }
    Connection::Commit(&con);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&extension_options);
    Connection::~Connection(&con);
  }
  if ((this->config).options.unrecognized_options._M_h._M_element_count != 0) {
    options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    options.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var4 = &(this->config).options.unrecognized_options._M_h._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&options,(value_type *)(p_Var4 + 1));
    }
    ::std::__cxx11::string::string((string *)&extension_name,", ",(allocator *)&extension_options);
    StringUtil::Join((string *)&con,&options,&extension_name);
    ::std::__cxx11::string::~string((string *)&extension_name);
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::operator+(&extension_name,"The following options were not recognized: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&con);
    InvalidInputException::InvalidInputException(pIVar3,&extension_name);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_0146c0d6:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&unrecognized_options_copy._M_h);
  return;
}

Assistant:

void DatabaseInstance::LoadExtensionSettings() {
	// copy the map, to protect against modifications during
	auto unrecognized_options_copy = config.options.unrecognized_options;

	if (config.options.autoload_known_extensions) {
		if (unrecognized_options_copy.empty()) {
			// Nothing to do
			return;
		}

		Connection con(*this);
		con.BeginTransaction();

		vector<string> extension_options;
		for (auto &option : unrecognized_options_copy) {
			auto &name = option.first;
			auto &value = option.second;

			auto extension_name = ExtensionHelper::FindExtensionInEntries(name, EXTENSION_SETTINGS);
			if (extension_name.empty()) {
				continue;
			}
			if (!ExtensionHelper::TryAutoLoadExtension(*this, extension_name)) {
				throw InvalidInputException(
				    "To set the %s setting, the %s extension needs to be loaded. But it could not be autoloaded.", name,
				    extension_name);
			}
			auto it = config.extension_parameters.find(name);
			if (it == config.extension_parameters.end()) {
				throw InternalException("Extension %s did not provide the '%s' config setting", extension_name, name);
			}
			// if the extension provided the option, it should no longer be unrecognized.
			D_ASSERT(config.options.unrecognized_options.find(name) == config.options.unrecognized_options.end());
			auto &context = *con.context;
			PhysicalSet::SetExtensionVariable(context, it->second, name, SetScope::GLOBAL, value);
			extension_options.push_back(name);
		}

		con.Commit();
	}
	if (!config.options.unrecognized_options.empty()) {
		ThrowExtensionSetUnrecognizedOptions(config.options.unrecognized_options);
	}
}